

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicString.h
# Opt level: O2

ulint __thiscall
bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::numberOfBits
          (DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *this)

{
  long lVar1;
  uint i;
  ulong uVar2;
  ulint uVar3;
  info_t local_78;
  
  if (this->unary_string == false) {
    lVar1 = 0;
    uVar3 = 0;
    for (uVar2 = 0; uVar2 < this->number_of_internal_nodes; uVar2 = uVar2 + 1) {
      bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>::info
                (&local_78,
                 (bitvector_t<4096UL,_(bv::allocation_policy_t)0> *)
                 ((long)&(((this->wavelet_tree).
                           super__Vector_base<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>,_std::allocator<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_impl)._M_t.
                         super___uniq_ptr_impl<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>,_std::default_delete<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>_>_>
                 + lVar1));
      uVar3 = uVar3 + local_78.capacity;
      lVar1 = lVar1 + 8;
    }
  }
  else {
    uVar3 = this->n;
  }
  return uVar3;
}

Assistant:

ulint numberOfBits(){//sum of the lengths of the bitvectors

		if(unary_string)
			return n;

		ulint tot=0;

		for(uint i=0;i<number_of_internal_nodes;i++)
			//tot += wavelet_tree[i].maxSize();
			tot += wavelet_tree[i].info().capacity;

		return tot;

	}